

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

int Emb_ManComputeDistance_old(Emb_Man_t *p,Emb_Obj_t *pPivot)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  int i;
  Vec_Int_t *p_01;
  int iVar7;
  ulong uVar8;
  
  p_00 = Vec_IntAlloc(1000);
  pVVar4 = Vec_IntAlloc(1000);
  uVar2 = p->nTravIds + 1;
  p->nTravIds = uVar2;
  (pPivot->field_7).TravId = uVar2;
  Vec_IntPush(p_00,pPivot->hHandle);
  iVar7 = 0;
  do {
    p_01 = pVVar4;
    iVar3 = p_00->nSize;
    if (iVar3 < 1) {
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      return iVar7;
    }
    p_01->nSize = 0;
    for (i = 0; i < iVar3; i = i + 1) {
      uVar2 = Vec_IntEntry(p_00,i);
      if (p->pObjData == (int *)0x0) break;
      puVar1 = (uint *)(p->pObjData + uVar2);
      for (uVar8 = 0; uVar8 < *puVar1 >> 4; uVar8 = uVar8 + 1) {
        lVar5 = (long)(int)puVar1[uVar8 + 5];
        if (puVar1[3 - lVar5] != p->nTravIds) {
          puVar1[3 - lVar5] = p->nTravIds;
          Vec_IntPush(p_01,puVar1[2 - lVar5]);
        }
      }
      for (lVar5 = 0; (int)lVar5 < (int)puVar1[1]; lVar5 = lVar5 + 1) {
        lVar6 = (long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar5 + 5];
        if (puVar1[lVar6 + 3] != p->nTravIds) {
          puVar1[lVar6 + 3] = p->nTravIds;
          Vec_IntPush(p_01,puVar1[lVar6 + 2]);
        }
      }
      iVar3 = p_00->nSize;
    }
    iVar7 = iVar7 + 1;
    pVVar4 = p_00;
    p_00 = p_01;
  } while( true );
}

Assistant:

int Emb_ManComputeDistance_old( Emb_Man_t * p, Emb_Obj_t * pPivot )
{
    Vec_Int_t * vThis, * vNext, * vTemp;
    Emb_Obj_t * pThis, * pNext;
    int i, k, d, nVisited = 0;
//    assert( Emb_ObjIsTerm(pPivot) );
    vThis = Vec_IntAlloc( 1000 );
    vNext = Vec_IntAlloc( 1000 );
    Emb_ManIncrementTravId( p );
    Emb_ObjSetTravIdCurrent( p, pPivot );
    Vec_IntPush( vThis, pPivot->hHandle );
    for ( d = 0; Vec_IntSize(vThis) > 0; d++ )
    {
        nVisited += Vec_IntSize(vThis);
        Vec_IntClear( vNext );
        Emb_ManForEachObjVec( vThis, p, pThis, i )
        {
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
                nVisited += !Emb_ObjIsTerm(pNext);
            }
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
                nVisited += !Emb_ObjIsTerm(pNext);
            }
        }
        vTemp = vThis; vThis = vNext; vNext = vTemp;
    }
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    // check if there are several strongly connected components
//    if ( nVisited < Emb_ManNodeNum(p) )
//        printf( "Visited less nodes (%d) than present (%d).\n", nVisited, Emb_ManNodeNum(p) );
    return d;
}